

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

uint16_t object_pack_total(player *p,object *obj,_Bool ignore_inscrip,object **first)

{
  _Bool _Var1;
  char cVar2;
  _Bool local_39;
  char test_label;
  object *poStack_38;
  _Bool like;
  object *cursor;
  char first_label;
  uint16_t total;
  object **first_local;
  _Bool ignore_inscrip_local;
  object *obj_local;
  player *p_local;
  
  cursor._6_2_ = 0;
  cursor._5_1_ = '\0';
  if (first != (object **)0x0) {
    *first = (object *)0x0;
  }
  for (poStack_38 = p->gear; poStack_38 != (object *)0x0; poStack_38 = poStack_38->next) {
    if (poStack_38 == obj) {
      _Var1 = object_is_equipped(p->body,obj);
      local_39 = (_Bool)((_Var1 ^ 0xffU) & 1);
    }
    else if (ignore_inscrip) {
      local_39 = object_similar(obj,poStack_38,OSTACK_PACK);
    }
    else {
      local_39 = object_stackable(obj,poStack_38,OSTACK_PACK);
    }
    if ((local_39 != false) &&
       (cursor._6_2_ = cursor._6_2_ + poStack_38->number, first != (object **)0x0)) {
      cVar2 = gear_to_label(p,poStack_38);
      if (*first == (object *)0x0) {
        *first = poStack_38;
        cursor._5_1_ = cVar2;
      }
      else if ((cVar2 < 'a') || ('z' < cVar2)) {
        if ((('/' < cVar2) && (cVar2 < ':')) &&
           ((cursor._5_1_ == '\0' ||
            ((('`' < cursor._5_1_ && (cursor._5_1_ < '{')) ||
             (('/' < cursor._5_1_ && ((cursor._5_1_ < ':' && (cVar2 < cursor._5_1_)))))))))) {
          *first = poStack_38;
          cursor._5_1_ = cVar2;
        }
      }
      else if ((cursor._5_1_ == '\0') ||
              ((('`' < cursor._5_1_ && (cursor._5_1_ < '{')) && (cVar2 < cursor._5_1_)))) {
        *first = poStack_38;
        cursor._5_1_ = cVar2;
      }
    }
  }
  return cursor._6_2_;
}

Assistant:

uint16_t object_pack_total(struct player *p, const struct object *obj,
		bool ignore_inscrip, struct object **first)
{
	uint16_t total = 0;
	char first_label = '\0';
	struct object *cursor;

	if (first) {
		*first = NULL;
	}
	for (cursor = p->gear; cursor; cursor = cursor->next) {
		bool like;

		if (cursor == obj) {
			/*
			 * object_similar() excludes cursor == obj so if
			 * obj is not equipped, account for it here.
			 */
			like = !object_is_equipped(p->body, obj);
		} else if (ignore_inscrip) {
			like = object_similar(obj, cursor, OSTACK_PACK);
		} else {
			like = object_stackable(obj, cursor, OSTACK_PACK);
		}
		if (like) {
			total += cursor->number;
			if (first) {
				char test_label = gear_to_label(p, cursor);

				if (!*first) {
					*first = cursor;
					first_label = test_label;
				} else {
					if (test_label >= 'a'
							&& test_label <= 'z') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					} else if (test_label >= '0'
							&& test_label <= '9') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z')
								|| (first_label >= '0'
								&& first_label <= '9'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					}
				}
			}
		}
	}

	return total;
}